

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitVarArg<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
          (ExprComparator *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
          e)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  
  piVar4 = (int *)0x0;
  piVar5 = *(int **)(this + 8);
  if (3 < **(int **)(this + 8) - 0x2aU) {
    piVar5 = piVar4;
  }
  iVar1 = piVar5[1];
  piVar3 = (int *)((long)*(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                        super_ExprBase.impl_ + 4) * 8);
  for (; ((int *)((long)iVar1 * 8) != piVar4 && (piVar3 != piVar4)); piVar4 = piVar4 + 2) {
    bVar2 = mp::Equal((Expr)((ExprBase *)((long)(piVar5 + 2) + (long)piVar4))->impl_,
                      (Expr)((ExprBase *)
                            ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                   super_ExprBase.impl_ + 8 + (long)piVar4))->impl_);
    if (!bVar2) {
      return false;
    }
  }
  return (int *)((long)iVar1 * 8) == piVar4 && piVar3 == piVar4;
}

Assistant:

bool ExprComparator::VisitVarArg(E e) {
  E vararg = Cast<E>(expr_);
  typename E::iterator i = vararg.begin(), iend = vararg.end();
  typename E::iterator j = e.begin(), jend = e.end();
  for (; i != iend; ++i, ++j) {
    if (j == jend || !Equal(*i, *j))
      return false;
  }
  return j == jend;
}